

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O2

JDIMENSION get_32bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  J_COLOR_SPACE JVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  _func_void_j_compress_ptr_cjpeg_source_ptr *__src;
  char cVar4;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  cjpeg_source_ptr pcVar13;
  size_t sVar14;
  JDIMENSION JVar15;
  JSAMPROW __dest;
  ulong uVar16;
  long lVar17;
  int iVar18;
  double dVar19;
  int iVar20;
  short sVar21;
  int iVar22;
  double dVar25;
  int iVar28;
  undefined1 auVar26 [16];
  double dVar29;
  undefined1 auVar27 [16];
  double dVar30;
  double dVar31;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined4 uVar23;
  undefined6 uVar24;
  
  if (sinfo[1].buffer_height == 0) {
    pcVar13 = sinfo + 2;
    sVar14 = fread(sinfo[2].start_input,1,(ulong)*(uint *)((long)&sinfo[1].input_file + 4),
                   (FILE *)sinfo->input_file);
    if (sVar14 != *(uint *)((long)&sinfo[1].input_file + 4)) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x2b;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
  }
  else {
    JVar15 = *(int *)&sinfo[1].input_file - 1;
    *(JDIMENSION *)&sinfo[1].input_file = JVar15;
    pcVar13 = (cjpeg_source_ptr)
              (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[1].finish_input,JVar15,1,0);
  }
  auVar12 = _DAT_0015bc40;
  __src = pcVar13->start_input;
  __dest = *sinfo->buffer;
  JVar1 = cinfo->in_color_space;
  uVar16 = (ulong)JVar1;
  if (uVar16 == 4) {
    JVar15 = cinfo->image_width;
    for (lVar17 = 0; JVar15 != (JDIMENSION)lVar17; lVar17 = lVar17 + 1) {
      dVar19 = (double)(byte)__src[lVar17 * 4 + 2] / -255.0 + 1.0;
      auVar26._0_8_ = (double)(*(ushort *)(__src + lVar17 * 4) & 0xff);
      auVar26._8_8_ = (double)(byte)(*(ushort *)(__src + lVar17 * 4) >> 8);
      auVar26 = divpd(auVar26,auVar12);
      dVar25 = auVar26._0_8_ + 1.0;
      dVar29 = auVar26._8_8_ + 1.0;
      dVar30 = dVar19;
      if (dVar29 <= dVar19) {
        dVar30 = dVar29;
      }
      if (dVar25 <= dVar30) {
        dVar30 = dVar25;
      }
      if ((dVar30 != 1.0) || (NAN(dVar30))) {
        dVar31 = 1.0 - dVar30;
        dVar19 = (dVar19 - dVar30) / dVar31;
        auVar27._0_8_ = dVar25 - dVar30;
        auVar27._8_8_ = dVar29 - dVar30;
        auVar11._8_8_ = dVar31;
        auVar11._0_8_ = dVar31;
        auVar26 = divpd(auVar27,auVar11);
      }
      else {
        auVar26 = ZEXT816(0);
        dVar19 = 0.0;
      }
      iVar18 = (int)((255.0 - auVar26._0_8_ * 255.0) + 0.5);
      iVar20 = (int)((255.0 - dVar30 * 255.0) + 0.5);
      iVar22 = (int)((255.0 - dVar19 * 255.0) + 0.5);
      iVar28 = (int)((255.0 - auVar26._8_8_ * 255.0) + 0.5);
      sVar8 = (short)iVar22;
      cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar22 - (0xff < sVar8);
      sVar8 = (short)((uint)iVar22 >> 0x10);
      sVar21 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar22 >> 0x10) -
                        (0xff < sVar8),cVar4);
      sVar8 = (short)iVar28;
      cVar5 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar28 - (0xff < sVar8);
      sVar8 = (short)((uint)iVar28 >> 0x10);
      uVar23 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar28 >> 0x10) -
                        (0xff < sVar8),CONCAT12(cVar5,sVar21));
      sVar8 = (short)iVar18;
      cVar6 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar18 - (0xff < sVar8);
      sVar8 = (short)((uint)iVar18 >> 0x10);
      uVar24 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar18 >> 0x10) -
                        (0xff < sVar8),CONCAT14(cVar6,uVar23));
      sVar8 = (short)iVar20;
      cVar7 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar20 - (0xff < sVar8);
      sVar10 = (short)((uint)iVar20 >> 0x10);
      sVar8 = (short)((uint)uVar23 >> 0x10);
      sVar9 = (short)((uint6)uVar24 >> 0x20);
      sVar10 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * (char)((uint)iVar20 >> 0x10) -
                                (0xff < sVar10),CONCAT16(cVar7,uVar24)) >> 0x30);
      *(uint *)(__dest + lVar17 * 4) =
           CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10),
                    CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                             CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                      (0 < sVar21) * (sVar21 < 0x100) * cVar4 - (0xff < sVar21))));
    }
  }
  else if ((JVar1 == JCS_EXT_BGRA) || (JVar1 == JCS_EXT_BGRX)) {
    memcpy(__dest,__src,(ulong)*(uint *)((long)&sinfo[1].input_file + 4));
  }
  else {
    iVar18 = rgb_red[uVar16];
    iVar20 = rgb_green[uVar16];
    iVar22 = rgb_blue[uVar16];
    iVar28 = rgb_pixelsize[uVar16];
    if ((JVar1 & ~JCS_YCbCr) == JCS_EXT_RGBA) {
      uVar2 = alpha_index[uVar16];
      JVar15 = cinfo->image_width;
      for (lVar17 = 0; JVar15 != (JDIMENSION)lVar17; lVar17 = lVar17 + 1) {
        __dest[iVar22] = (JSAMPLE)__src[lVar17 * 4];
        __dest[iVar20] = (JSAMPLE)__src[lVar17 * 4 + 1];
        __dest[iVar18] = (JSAMPLE)__src[lVar17 * 4 + 2];
        __dest[uVar2] = (JSAMPLE)__src[lVar17 * 4 + 3];
        __dest = __dest + iVar28;
      }
    }
    else {
      JVar15 = cinfo->image_width;
      for (lVar17 = 0; JVar15 != (JDIMENSION)lVar17; lVar17 = lVar17 + 1) {
        __dest[iVar22] = (JSAMPLE)__src[lVar17 * 4];
        __dest[iVar20] = (JSAMPLE)__src[lVar17 * 4 + 1];
        __dest[iVar18] = (JSAMPLE)__src[lVar17 * 4 + 2];
        __dest = __dest + iVar28;
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_32bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 32-bit pixels */
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  JSAMPARRAY image_ptr;
  register JSAMPROW inptr, outptr;
  register JDIMENSION col;

  if (source->use_inversion_array) {
    /* Fetch next row from virtual array */
    source->source_row--;
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->whole_image,
       source->source_row, (JDIMENSION)1, FALSE);
    inptr = image_ptr[0];
  } else {
    if (!ReadOK(source->pub.input_file, source->iobuffer, source->row_width))
      ERREXIT(cinfo, JERR_INPUT_EOF);
    inptr = source->iobuffer;
  }

  /* Transfer data.  Note source values are in BGR order
   * (even though Microsoft's own documents say the opposite).
   */
  outptr = source->pub.buffer[0];
  if (cinfo->in_color_space == JCS_EXT_BGRX ||
      cinfo->in_color_space == JCS_EXT_BGRA) {
    MEMCOPY(outptr, inptr, source->row_width);
  } else if (cinfo->in_color_space == JCS_CMYK) {
    for (col = cinfo->image_width; col > 0; col--) {
      JSAMPLE b = *inptr++, g = *inptr++, r = *inptr++;
      rgb_to_cmyk(r, g, b, outptr, outptr + 1, outptr + 2, outptr + 3);
      inptr++;                          /* skip the 4th byte (Alpha channel) */
      outptr += 4;
    }
  } else {
    register int rindex = rgb_red[cinfo->in_color_space];
    register int gindex = rgb_green[cinfo->in_color_space];
    register int bindex = rgb_blue[cinfo->in_color_space];
    register int aindex = alpha_index[cinfo->in_color_space];
    register int ps = rgb_pixelsize[cinfo->in_color_space];

    if (aindex >= 0) {
      for (col = cinfo->image_width; col > 0; col--) {
        outptr[bindex] = *inptr++;
        outptr[gindex] = *inptr++;
        outptr[rindex] = *inptr++;
        outptr[aindex] = *inptr++;
        outptr += ps;
      }
    } else {
      for (col = cinfo->image_width; col > 0; col--) {
        outptr[bindex] = *inptr++;
        outptr[gindex] = *inptr++;
        outptr[rindex] = *inptr++;
        inptr++;                        /* skip the 4th byte (Alpha channel) */
        outptr += ps;
      }
    }
  }

  return 1;
}